

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O1

char * __thiscall Exception::what(Exception *this)

{
  char *pcVar1;
  undefined8 *puVar2;
  allocator local_29;
  undefined1 *local_28 [2];
  undefined1 local_18 [16];
  
  std::__cxx11::string::string((string *)local_28,this->err_msg,&local_29);
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)local_28,(ulong)(this->err_word)._M_dataplus._M_p);
  pcVar1 = (char *)*puVar2;
  if (local_28[0] != local_18) {
    operator_delete(local_28[0]);
  }
  return pcVar1;
}

Assistant:

const char* Exception::what() const throw(){
    return string(err_msg).append(err_word).c_str();
}